

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

OPJ_INT32 opj_mqc_decode(opj_mqc_t *mqc)

{
  OPJ_UINT32 local_14;
  OPJ_INT32 d;
  opj_mqc_t *mqc_local;
  
  mqc->a = mqc->a - (*mqc->curctx)->qeval;
  if (mqc->c >> 0x10 < (*mqc->curctx)->qeval) {
    local_14 = opj_mqc_lpsexchange(mqc);
    opj_mqc_renormd(mqc);
  }
  else {
    mqc->c = mqc->c + (*mqc->curctx)->qeval * -0x10000;
    if ((mqc->a & 0x8000) == 0) {
      local_14 = opj_mqc_mpsexchange(mqc);
      opj_mqc_renormd(mqc);
    }
    else {
      local_14 = (*mqc->curctx)->mps;
    }
  }
  return local_14;
}

Assistant:

OPJ_INT32 opj_mqc_decode(opj_mqc_t *const mqc) {
	OPJ_INT32 d;
	mqc->a -= (*mqc->curctx)->qeval;
	if ((mqc->c >> 16) < (*mqc->curctx)->qeval) {
		d = opj_mqc_lpsexchange(mqc);
		opj_mqc_renormd(mqc);
	} else {
		mqc->c -= (*mqc->curctx)->qeval << 16;
		if ((mqc->a & 0x8000) == 0) {
			d = opj_mqc_mpsexchange(mqc);
			opj_mqc_renormd(mqc);
		} else {
			d = (OPJ_INT32)(*mqc->curctx)->mps;
		}
	}

	return d;
}